

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLongNames.cpp
# Opt level: O1

void __thiscall TestLongFunction::Run(TestLongFunction *this)

{
  bool bVar1;
  int t;
  long lVar2;
  char name [2048];
  char code [8192];
  undefined1 auStack_2838 [2047];
  undefined1 local_2039;
  char local_2038 [8200];
  
  memset(auStack_2838,0x61,0x800);
  local_2039 = 0;
  lVar2 = 0;
  NULLC::SafeSprintf(local_2038,0x2000,
                     "void foo(int bar){ int %s(){ return bar; } int %s(int u){ return bar + u; } } return 1;"
                     ,auStack_2838);
  do {
    if ((&Tests::testExecutor)[lVar2] == '\x01') {
      testsCount[lVar2] = testsCount[lVar2] + 1;
      bVar1 = Tests::RunCode(local_2038,testTarget[lVar2],"1","Long function name.",false);
      if (bVar1) {
        testsPassed[lVar2] = testsPassed[lVar2] + 1;
      }
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return;
}

Assistant:

virtual void Run()
	{
		char code[8192];
		char name[NULLC_MAX_VARIABLE_NAME_LENGTH];
		for(unsigned int i = 0; i < NULLC_MAX_VARIABLE_NAME_LENGTH; i++)
			name[i] = 'a';
		name[NULLC_MAX_VARIABLE_NAME_LENGTH - 1] = 0;
		NULLC::SafeSprintf(code, 8192, "void foo(int bar){ int %s(){ return bar; } int %s(int u){ return bar + u; } } return 1;", name, name);
		for(int t = 0; t < TEST_TARGET_COUNT; t++)
		{
			if(!Tests::testExecutor[t])
				continue;

			testsCount[t]++;
			if(Tests::RunCode(code, testTarget[t], "1", "Long function name."))
				testsPassed[t]++;
		}
	}